

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O1

void __thiscall cmsys::Glob::Glob(Glob *this)

{
  GlobInternals *pGVar1;
  
  (this->Relative)._M_dataplus._M_p = (pointer)&(this->Relative).field_2;
  (this->Relative)._M_string_length = 0;
  (this->Relative).field_2._M_local_buf[0] = '\0';
  (this->VisitedSymlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->VisitedSymlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->VisitedSymlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar1 = (GlobInternals *)operator_new(0x30);
  (pGVar1->Expressions).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar1->Expressions).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pGVar1->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pGVar1->Expressions).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar1->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar1->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->Internals = pGVar1;
  this->Recurse = false;
  std::__cxx11::string::_M_replace((ulong)&this->Relative,0,(char *)0x0,0x8618f5);
  this->RecurseThroughSymlinks = true;
  this->FollowedSymlinkCount = 0;
  this->ListDirs = true;
  this->RecurseListDirs = false;
  return;
}

Assistant:

Glob::Glob()
{
  this->Internals = new GlobInternals;
  this->Recurse = false;
  this->Relative = "";

  this->RecurseThroughSymlinks = true;
  // RecurseThroughSymlinks is true by default for backwards compatibility,
  // not because it's a good idea...
  this->FollowedSymlinkCount = 0;

  // Keep separate variables for directory listing for back compatibility
  this->ListDirs = true;
  this->RecurseListDirs = false;
}